

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_archiver.cpp
# Opt level: O0

vector<bool,_std::allocator<bool>_> *
HuffmanArchiver::decode_full_code(vector<bool,_std::allocator<bool>_> *full_code)

{
  bool bVar1;
  vector<bool,_std::allocator<bool>_> *in_RSI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  iterator iVar2;
  reference rVar3;
  iterator iVar4;
  iterator it;
  vector<bool,_std::allocator<bool>_> *code;
  _Bit_iterator_base *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  reference local_a8;
  _Bit_type *local_98;
  uint local_90;
  _Bit_type *local_88;
  uint local_80;
  _Bit_type *local_78;
  uint local_70;
  _Bit_type *local_68;
  uint local_60;
  reference local_48;
  _Bit_type *local_38;
  uint local_30;
  _Bit_type *local_28;
  uint local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x125de6);
  iVar2 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)0x125df0);
  local_38 = iVar2.super__Bit_iterator_base._M_p;
  local_30 = iVar2.super__Bit_iterator_base._M_offset;
  local_28 = local_38;
  local_20 = local_30;
  while( true ) {
    rVar3 = std::_Bit_iterator::operator*((_Bit_iterator *)0x125e2a);
    local_48 = rVar3;
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_48);
    if (!bVar1) break;
    iVar4 = std::_Bit_iterator::operator++((_Bit_iterator *)in_stack_fffffffffffffed8,0);
    local_68 = iVar4.super__Bit_iterator_base._M_p;
    local_60 = iVar4.super__Bit_iterator_base._M_offset;
  }
  iVar4 = std::_Bit_iterator::operator++((_Bit_iterator *)in_stack_fffffffffffffed8,0);
  local_78 = iVar4.super__Bit_iterator_base._M_p;
  local_70 = iVar4.super__Bit_iterator_base._M_offset;
  while( true ) {
    iVar2 = std::vector<bool,_std::allocator<bool>_>::end(in_RSI);
    local_98 = iVar2.super__Bit_iterator_base._M_p;
    local_90 = iVar2.super__Bit_iterator_base._M_offset;
    local_88 = local_98;
    local_80 = local_90;
    bVar1 = std::operator!=((_Bit_iterator_base *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffed8);
    if (!bVar1) break;
    rVar3 = std::_Bit_iterator::operator*((_Bit_iterator *)0x125f5c);
    local_a8 = rVar3;
    std::_Bit_reference::operator_cast_to_bool(&local_a8);
    std::vector<bool,_std::allocator<bool>_>::push_back(in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
    iVar4 = std::_Bit_iterator::operator++((_Bit_iterator *)in_stack_fffffffffffffed8,0);
    in_stack_fffffffffffffee4 = iVar4.super__Bit_iterator_base._M_offset;
  }
  return in_RDI;
}

Assistant:

std::vector<bool> HuffmanArchiver::decode_full_code(std::vector<bool> full_code) {
    std::vector<bool> code;
    auto it = full_code.begin();
    while (*it == 1) {
        it++;
    }
    it++;
    for (; it != full_code.end(); it++) {
        code.push_back(*it);
    }
    return code;
}